

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_MessageBook.cpp
# Opt level: O1

PersonHandle * __thiscall
mbc::Val::MessageBook::sreach
          (PersonHandle *__return_storage_ptr__,MessageBook *this,string *thing,string *attr_)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>_>
  *pmVar1;
  Person *this_00;
  pointer pcVar2;
  size_t __n;
  PersonHandle *pPVar3;
  int iVar4;
  _ValAtom *p_Var5;
  undefined4 extraout_var;
  _Rb_tree_node_base *p_Var6;
  bool bVar7;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  Person *local_70;
  string local_68;
  MessageBook *local_48;
  string *local_40;
  PersonHandle *local_38;
  
  pmVar1 = this->persons_;
  local_38 = __return_storage_ptr__;
  local_48 = this;
  local_40 = thing;
  for (p_Var6 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,*(long *)(p_Var6 + 1),
               (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
    this_00 = *(Person **)(p_Var6 + 2);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    pcVar2 = (attr_->_M_dataplus)._M_p;
    local_70 = this_00;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + attr_->_M_string_length);
    p_Var5 = Person::attr(this_00,&local_68);
    iVar4 = (*(p_Var5->super_ValBase)._vptr_ValBase[4])(p_Var5);
    __n = ((undefined8 *)CONCAT44(extraout_var,iVar4))[1];
    if (__n == local_40->_M_string_length) {
      if (__n == 0) {
        bVar7 = true;
      }
      else {
        iVar4 = bcmp(*(void **)CONCAT44(extraout_var,iVar4),(local_40->_M_dataplus)._M_p,__n);
        bVar7 = iVar4 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    if (bVar7) break;
  }
  pPVar3 = local_38;
  if ((_Rb_tree_header *)p_Var6 == &(local_48->persons_->_M_t)._M_impl.super__Rb_tree_header) {
    newPerson(local_38,local_48);
  }
  else {
    PersonHandle::PersonHandle(local_38,local_48,*(Person **)(p_Var6 + 2));
  }
  return pPVar3;
}

Assistant:

PersonHandle MessageBook::sreach(string thing, string attr_) {
    auto it = std::find_if(persons_ -> begin(), persons_ -> end(),
            [&](const std::pair<string, Person*>& pair) {
                return pair.second -> attr(attr_) -> raw() == thing;
            });
    if(it != persons_ -> end()) {
        return PersonHandle(this, it -> second);
    } else {
        return newPerson();
        // throw "the result of sreach is too little";
    }
}